

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMethods.cpp
# Opt level: O2

void __thiscall
slang::ast::builtins::StringSubstrMethod::~StringSubstrMethod(StringSubstrMethod *this)

{
  SimpleSystemSubroutine::~SimpleSystemSubroutine(&this->super_SimpleSystemSubroutine);
  operator_delete(this,0x68);
  return;
}

Assistant:

explicit StringSubstrMethod(Compilation& comp) :
        SimpleSystemSubroutine("substr", SubroutineKind::Function, 2,
                               {&comp.getIntType(), &comp.getIntType()}, comp.getStringType(),
                               true) {}